

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O3

void __thiscall Calculator::parse(Calculator *this,String *e)

{
  Array<Calculator::Token> *this_00;
  Stack<Calculator::Token> *this_01;
  Token *x;
  char cVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  Token *pTVar9;
  uint uVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  Array<Calculator::Token> *this_02;
  String name;
  String e1;
  byte local_92;
  char local_91;
  Calculator *local_90;
  Token local_88;
  String local_60;
  String local_48;
  
  asl::Array<Calculator::Token>::resize(&this->_input,0);
  this_00 = &this->_output;
  local_90 = this;
  asl::Array<Calculator::Token>::resize(this_00,0);
  local_88.x = (double)CONCAT71(local_88.x._1_7_,0x20);
  asl::String::concat(&local_48,e,(char *)&local_88,1);
  uVar11 = local_48.field_2._str;
  if (local_48._size == 0) {
    uVar11 = &local_48.field_2;
  }
  local_60.field_2._space[0] = '\0';
  local_60._size = 0;
  local_60._len = 0;
  bVar4 = *(byte *)uVar11;
  local_92 = bVar4;
  if (bVar4 != 0) {
    iVar5 = 0;
    do {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(uVar11 + 1);
      local_92 = bVar4;
      if (iVar5 == 4) {
        if (((((byte)(bVar4 - 0x30) < 10) || (bVar4 == 0x65)) || (bVar4 == 0x2e)) ||
           ((bVar4 == 0x2d && (*(byte *)(uVar11 + -1) == 0x65)))) {
          iVar5 = 4;
          asl::String::operator+=(&local_60,bVar4);
          uVar11 = paVar7;
        }
        else {
          paVar7 = &local_60.field_2;
          if (local_60._size != 0) {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT71(local_60.field_2._1_7_,local_60.field_2._space[0]);
          }
          local_88.x = atof(paVar7->_space);
          local_88.val._size = 0;
          local_88.val._len = 0;
          local_88.val.field_2._space[0] = 0;
          local_88.type = NUMBER;
          asl::Array<Calculator::Token>::insert(&local_90->_input,-1,&local_88);
LAB_00106ca4:
          if (local_88.val._size != 0) {
            free((void *)CONCAT62(local_88.val.field_2._2_6_,
                                  CONCAT11(local_88.val.field_2._space[1],
                                           local_88.val.field_2._space[0])));
          }
          iVar5 = 0;
        }
      }
      else if (iVar5 == 3) {
        iVar5 = isalnum((int)(char)bVar4);
        if (iVar5 == 0) {
          iVar5 = local_60._len;
          asl::String::alloc(&local_88.val,local_60._len);
          local_88.val._len = iVar5;
          paVar7 = &local_88.val.field_2;
          if (local_88.val._size != 0) {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT62(local_88.val.field_2._2_6_,
                              CONCAT11(local_88.val.field_2._space[1],local_88.val.field_2._space[0]
                                      ));
          }
          paVar8 = &local_60.field_2;
          if (local_60._size != 0) {
            paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT71(local_60.field_2._1_7_,local_60.field_2._space[0]);
          }
          memcpy(paVar7,paVar8,(long)iVar5 + 1);
          local_88.type = NAME;
          asl::Array<Calculator::Token>::insert(&local_90->_input,-1,&local_88);
          goto LAB_00106ca4;
        }
        iVar5 = 3;
        asl::String::operator+=(&local_60,bVar4);
        uVar11 = paVar7;
      }
      else {
        uVar11 = paVar7;
        if (iVar5 == 0) {
          uVar10 = bVar4 - 0x28;
          if (uVar10 < 0x37) {
            if ((0x400000000000acU >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
              if ((3UL >> ((ulong)uVar10 & 0x3f) & 1) == 0) goto LAB_00106d35;
              asl::String::alloc(&local_88.val,1);
              local_88.val._len = 1;
              paVar8 = &local_88.val.field_2;
              if (local_88.val._size != 0) {
                paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                         CONCAT62(local_88.val.field_2._2_6_,
                                  CONCAT11(local_88.val.field_2._space[1],
                                           local_88.val.field_2._space[0]));
              }
              *(ushort *)paVar8 = (ushort)bVar4;
              local_88.type = SEP;
              asl::Array<Calculator::Token>::insert(&local_90->_input,-1,&local_88);
            }
            else {
              local_88.val._size = 0;
              local_88.val._len = 1;
              local_88.val.field_2._space[1] = '\0';
              local_88.type = OP;
              local_88.val.field_2._space[0] = bVar4;
              asl::Array<Calculator::Token>::insert(&local_90->_input,-1,&local_88);
            }
            if (local_88.val._size != 0) {
              free((void *)CONCAT62(local_88.val.field_2._2_6_,
                                    CONCAT11(local_88.val.field_2._space[1],
                                             local_88.val.field_2._space[0])));
            }
LAB_00106d1f:
            iVar5 = 0;
          }
          else {
LAB_00106d35:
            if ((byte)(bVar4 - 0x30) < 10 || (byte)(bVar4 - 0x2d) < 2) {
              iVar5 = 4;
              asl::String::operator=(&local_60,(char *)&local_92);
            }
            else {
              iVar5 = isalpha((int)(char)bVar4);
              if (iVar5 == 0) goto LAB_00106d1f;
              iVar5 = 3;
              asl::String::operator=(&local_60,(char *)&local_92);
            }
          }
        }
      }
      bVar4 = *(byte *)uVar11;
    } while (bVar4 != 0);
    local_92 = 0;
  }
  lVar12 = (long)*(int *)((long)&(local_90->_input)._a[-1].val.field_2 + 8);
  if (0 < lVar12) {
    this_01 = &local_90->_operators;
    uVar6 = 0;
    uVar13 = lVar12 << 0x20;
LAB_00106da8:
    pTVar9 = (local_90->_input)._a;
    iVar5 = (int)uVar13;
    if (3 < pTVar9[iVar5].type - OP) goto LAB_00107178;
    x = pTVar9 + iVar5;
    paVar7 = &pTVar9[iVar5].val.field_2;
    this_02 = this_00;
    switch(pTVar9[iVar5].type) {
    case OP:
      paVar8 = paVar7;
      if ((x->val)._size != 0) {
        paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
      }
      local_91 = paVar8->_space[0];
      if (local_91 != '-') goto LAB_00106fbf;
      if ((int)uVar6 != 0) {
        lVar12 = (long)((uVar13 << 0x20) + -0x100000000) >> 0x20;
        pTVar9 = (local_90->_input)._a;
        if (pTVar9[lVar12].type != OP) {
          if (pTVar9[lVar12].val._len == 1) {
            if (pTVar9[lVar12].val._size == 0) {
              paVar8 = &pTVar9[lVar12].val.field_2;
            }
            else {
              paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[lVar12].val.field_2._str;
            }
            if (paVar8->_space[0] == '(') goto LAB_00106e35;
          }
LAB_00106fbf:
          pTVar9 = (this_01->super_Array<Calculator::Token>)._a;
          uVar10 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
          while (this_02 = &this_01->super_Array<Calculator::Token>, 0 < (int)uVar10) {
            iVar5 = pTVar9[(ulong)uVar10 - 1].val._len;
            if (iVar5 == 1) {
              if (pTVar9[(ulong)uVar10 - 1].val._size == 0) {
                paVar8 = &pTVar9[(ulong)uVar10 - 1].val.field_2;
              }
              else {
                paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                         pTVar9[(ulong)uVar10 - 1].val.field_2._str;
              }
              if (paVar8->_space[0] == '(') break;
            }
            iVar2 = (x->val)._len;
            if (local_91 == '^') {
              bVar14 = 3;
              bVar4 = 3;
              if (iVar2 == 1) {
                paVar8 = paVar7;
                if ((x->val)._size != 0) {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
                }
                cVar1 = paVar8->_space[0];
                if (cVar1 == '*') {
                  bVar4 = 2;
                }
                else {
                  bVar4 = 1;
                  if ((cVar1 != '+') && (cVar1 != '-')) {
                    bVar4 = cVar1 == '/' ^ 3;
                  }
                }
              }
              if (iVar5 == 1) {
                if (pTVar9[(ulong)uVar10 - 1].val._size == 0) {
                  paVar8 = &pTVar9[(ulong)uVar10 - 1].val.field_2;
                }
                else {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                           pTVar9[(ulong)uVar10 - 1].val.field_2._str;
                }
                cVar1 = paVar8->_space[0];
                if (cVar1 == '*') {
                  bVar14 = 2;
                }
                else {
                  bVar14 = 1;
                  if ((cVar1 != '+') && (cVar1 != '-')) {
                    bVar14 = cVar1 == '/' ^ 3;
                  }
                }
              }
              if (bVar14 <= bVar4) break;
            }
            else {
              bVar14 = 3;
              bVar4 = 3;
              if (iVar2 == 1) {
                paVar8 = paVar7;
                if ((x->val)._size != 0) {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
                }
                cVar1 = paVar8->_space[0];
                if (cVar1 == '*') {
                  bVar4 = 2;
                }
                else {
                  bVar4 = 1;
                  if ((cVar1 != '+') && (cVar1 != '-')) {
                    bVar4 = cVar1 == '/' ^ 3;
                  }
                }
              }
              if (iVar5 == 1) {
                if (pTVar9[(ulong)uVar10 - 1].val._size == 0) {
                  paVar8 = &pTVar9[(ulong)uVar10 - 1].val.field_2;
                }
                else {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                           pTVar9[(ulong)uVar10 - 1].val.field_2._str;
                }
                cVar1 = paVar8->_space[0];
                if (cVar1 == '*') {
                  bVar14 = 2;
                }
                else {
                  bVar14 = 1;
                  if ((cVar1 != '+') && (cVar1 != '-')) {
                    bVar14 = cVar1 == '/' ^ 3;
                  }
                }
              }
              if (bVar14 < bVar4) break;
            }
            asl::Stack<Calculator::Token>::popget(&local_88,this_01);
            asl::Array<Calculator::Token>::insert(this_00,-1,&local_88);
            if (local_88.val._size != 0) {
              free((void *)CONCAT62(local_88.val.field_2._2_6_,
                                    CONCAT11(local_88.val.field_2._space[1],
                                             local_88.val.field_2._space[0])));
            }
            pTVar9 = (this_01->super_Array<Calculator::Token>)._a;
            uVar10 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
          }
          goto switchD_00106dea_caseD_4;
        }
      }
LAB_00106e35:
      local_88.val._size = 0;
      local_88.val._len = 1;
      local_88.val.field_2._space[0] = 0x5f;
      local_88.val.field_2._space[1] = '\0';
      local_88.type = OP;
      asl::Array<Calculator::Token>::insert(&this_01->super_Array<Calculator::Token>,-1,&local_88);
      break;
    case SEP:
      if ((x->val)._size != 0) {
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
      }
      if (paVar7->_space[0] != '(') {
        if (paVar7->_space[0] == ')') {
LAB_00106e88:
          pTVar9 = (this_01->super_Array<Calculator::Token>)._a;
          iVar5 = *(int *)((long)&pTVar9[-1].val.field_2 + 8);
          if (pTVar9[(long)iVar5 + -1].val._len == 1) {
            if (pTVar9[(long)iVar5 + -1].val._size == 0) {
              paVar7 = &pTVar9[(long)iVar5 + -1].val.field_2;
            }
            else {
              paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       pTVar9[(long)iVar5 + -1].val.field_2._str;
            }
            if (paVar7->_space[0] == '(') goto LAB_00106f75;
          }
          asl::Stack<Calculator::Token>::popget(&local_88,this_01);
          asl::Array<Calculator::Token>::insert(this_00,-1,&local_88);
          if (local_88.val._size != 0) {
            free((void *)CONCAT62(local_88.val.field_2._2_6_,
                                  CONCAT11(local_88.val.field_2._space[1],
                                           local_88.val.field_2._space[0])));
          }
          goto LAB_00106e88;
        }
        goto LAB_00107178;
      }
      local_88.val._size = 0;
      local_88.val._len = 1;
      local_88.val.field_2._space[0] = 0x28;
      local_88.val.field_2._space[1] = '\0';
      local_88.type = OP;
      asl::Array<Calculator::Token>::insert(&this_01->super_Array<Calculator::Token>,-1,&local_88);
      break;
    case NAME:
      lVar12 = (long)((uVar13 << 0x20) + 0x100000000) >> 0x20;
      pTVar9 = (local_90->_input)._a;
      if ((pTVar9[lVar12].type == SEP) && (pTVar9[lVar12].val._len == 1)) {
        if (pTVar9[lVar12].val._size == 0) {
          paVar7 = &pTVar9[lVar12].val.field_2;
        }
        else {
          paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[lVar12].val.field_2._str;
        }
        this_02 = &this_01->super_Array<Calculator::Token>;
        if (paVar7->_space[0] != '(') {
          this_02 = this_00;
        }
      }
    case NUMBER:
switchD_00106dea_caseD_4:
      asl::Array<Calculator::Token>::insert(this_02,-1,x);
      goto LAB_00107178;
    }
    if (local_88.val._size != 0) {
      free((void *)CONCAT62(local_88.val.field_2._2_6_,
                            CONCAT11(local_88.val.field_2._space[1],local_88.val.field_2._space[0]))
          );
    }
    goto LAB_00107178;
  }
LAB_001071a0:
  pTVar9 = (local_90->_operators).super_Array<Calculator::Token>._a;
  uVar10 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
  if (0 < (int)uVar10) {
    local_90 = (Calculator *)&local_90->_operators;
    do {
      uVar6 = (ulong)uVar10;
      if (pTVar9[uVar6 - 1].val._len == 1) {
        if (pTVar9[uVar6 - 1].val._size == 0) {
          paVar7 = &pTVar9[uVar6 - 1].val.field_2;
        }
        else {
          paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[uVar6 - 1].val.field_2._str;
        }
        if ((paVar7->_space[0] & 0xfeU) == 0x28) {
          puts("Mismatch");
          break;
        }
      }
      asl::Stack<Calculator::Token>::popget(&local_88,(Stack<Calculator::Token> *)local_90);
      asl::Array<Calculator::Token>::insert(this_00,-1,&local_88);
      if (local_88.val._size != 0) {
        free((void *)CONCAT62(local_88.val.field_2._2_6_,
                              CONCAT11(local_88.val.field_2._space[1],local_88.val.field_2._space[0]
                                      )));
      }
      pTVar9 = (local_90->_input)._a;
      uVar10 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
    } while (0 < (int)uVar10);
  }
  if (local_60._size != 0) {
    free((void *)CONCAT71(local_60.field_2._1_7_,local_60.field_2._space[0]));
  }
  if (local_48._size != 0) {
    free(local_48.field_2._str);
  }
  return;
LAB_00106f75:
  asl::Array<Calculator::Token>::resize(&this_01->super_Array<Calculator::Token>,iVar5 + -1);
LAB_00107178:
  uVar6 = uVar13 + 1;
  uVar3 = uVar13 >> 0x20;
  uVar13 = uVar13 & 0xffffffff00000000 | uVar6 & 0xffffffff;
  if ((int)uVar3 <= (int)uVar6) goto LAB_001071a0;
  goto LAB_00106da8;
}

Assistant:

void Calculator::parse(const String& e)
{
	_input.clear();
	_output.clear();
	String e1 = e + ' ';
	const char* p = e1;
	String name;
	TokenType type = NONE;
	while (char c = *p++)
	{
		switch (type) {
		case NONE:
			switch (c)
			{
			case '+': case '-': case '*': case '/': case '^':
				_input << c;
				break;
			case '(': case ')':
				_input << Token(SEP, String(c));
				break;
			default:
				if ((c >= '0' && c <= '9') || c == '.' || c == '-') {
					type = NUMBER;
					name = c;
				}
				else if (isalpha(c)) {
					type = NAME;
					name = c;
				}
				break;
			}
			break;
		case NUMBER:
			if (!((c >= '0' && c <= '9') || c == '.' || c == 'e' || (c=='-' && *(p-2)=='e'))) {
				_input << Token((double)name);
				type = NONE;
				p--;
				break;
			}
			else
				name << c;
			break;
		case NAME:
			if (isalnum(c))
				name << c;
			else
			{
				_input << Token(NAME, name);
				p--;
				type = NONE;
			}
			break;
		default:
			break;
		}
	}

	// build reverse

	foreach2(int i, const Token& token, _input)
	{
		char op;
		switch (token.type)
		{
		case NUMBER: _output << token;
			break;
		case NAME:
			if (_input[i + 1].type == SEP && _input[i + 1].val == '(')
				_operators.push(token);
			else
				_output << token;
			break;
		case SEP:
			op = token.val[0];
			switch (op)
			{
			case '(': _operators.push(op);
				break;
			case ')':
				while (_operators.top().val != '(')
					_output << _operators.popget();
				_operators.pop();
				break;
			}
			break;

		case OP:
			op = token.val[0];
			if (op == '-' && (i == 0 || _input[i - 1].type == OP || _input[i - 1].val == '('))
			{
				_operators.push('_');
				break;
			}
			while (_operators.length() > 0 && _operators.top().val != '(' && (
				(op != '^' && precedence(token.val) <= precedence(_operators.top().val)) ||
				(op == '^' && precedence(token.val) < precedence(_operators.top().val))))
				_output << _operators.popget();
			_operators.push(token);
		default:
			break;
		}
	}

	while (_operators.length() > 0)
	{
		if (_operators.top().val == '(' || _operators.top().val == ')') {
			printf("Mismatch\n");
			return;
		}
		else
			_output << _operators.popget();
	}
}